

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

uint anon_unknown.dwarf_1924db::SafeParse<unsigned_int>(char *data,char *end)

{
  uint result;
  char *end_local;
  char *data_local;
  
  return *(uint *)data;
}

Assistant:

T SafeParse(const char* data, const char* end) {
        // Actual size validation happens during Tokenization so
        // this is valid as an assertion.
        (void)(end);
        ai_assert(static_cast<size_t>(end - data) >= sizeof(T));
        T result = static_cast<T>(0);
        ::memcpy(&result, data, sizeof(T));
        return result;
    }